

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

HighsInt __thiscall
HighsCliqueTable::runCliqueSubsumption
          (HighsCliqueTable *this,HighsDomain *globaldom,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  pointer puVar4;
  pointer pCVar5;
  int *piVar6;
  pointer puVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  bool bVar11;
  uint uVar12;
  ulong __new_size;
  pointer pCVar13;
  const_iterator cVar14;
  pointer pCVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  const_iterator cVar19;
  CliqueVar *pCVar20;
  iterator __begin5;
  HighsInt cliqueid;
  undefined4 uStack_5c;
  int local_54;
  uint local_50;
  CliqueVar v;
  
  pCVar20 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_start;
  cVar14._M_current =
       (clique->
       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  lVar18 = (long)cVar14._M_current - (long)pCVar20;
  if (lVar18 == 8) {
    return 0;
  }
  __new_size = ((long)(this->cliques).
                      super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x14;
  if ((ulong)((long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < __new_size) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->cliquehits,__new_size);
    pCVar20 = (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_start;
    cVar14._M_current =
         (clique->
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    lVar18 = (long)cVar14._M_current - (long)pCVar20;
  }
  puVar4 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar16 = (long)cVar14._M_current - (long)pCVar20;
  for (lVar18 = lVar18 >> 4; 0 < lVar18; lVar18 = lVar18 + -1) {
    cVar19._M_current = pCVar20;
    if (puVar4[(uint)*pCVar20 & 0x7fffffff] != '\0') goto LAB_00274a2b;
    if (puVar4[(uint)pCVar20[1] & 0x7fffffff] != '\0') {
      cVar19._M_current = pCVar20 + 1;
      goto LAB_00274a2b;
    }
    if (puVar4[(uint)pCVar20[2] & 0x7fffffff] != '\0') {
      cVar19._M_current = pCVar20 + 2;
      goto LAB_00274a2b;
    }
    if (puVar4[(uint)pCVar20[3] & 0x7fffffff] != '\0') {
      cVar19._M_current = pCVar20 + 3;
      goto LAB_00274a2b;
    }
    pCVar20 = pCVar20 + 4;
    lVar16 = lVar16 + -0x10;
  }
  lVar16 = lVar16 >> 2;
  if (lVar16 == 1) {
LAB_00274a09:
    cVar19._M_current = pCVar20;
    if (puVar4[(uint)*pCVar20 & 0x7fffffff] == '\0') {
      cVar19._M_current = cVar14._M_current;
    }
LAB_00274a2b:
    pCVar20 = cVar19._M_current;
    if (cVar19._M_current != cVar14._M_current) {
      do {
        do {
          pCVar20 = pCVar20 + 1;
          if (pCVar20 == cVar14._M_current) {
            cVar14._M_current =
                 (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_00274a6f;
          }
        } while ((this->colDeleted).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[(uint)*pCVar20 & 0x7fffffff] != '\0');
        *cVar19._M_current = *pCVar20;
        cVar19._M_current = cVar19._M_current + 1;
      } while( true );
    }
  }
  else {
    if (lVar16 == 2) {
LAB_002749f7:
      cVar19._M_current = pCVar20;
      if (puVar4[(uint)*pCVar20 & 0x7fffffff] == '\0') {
        pCVar20 = pCVar20 + 1;
        goto LAB_00274a09;
      }
      goto LAB_00274a2b;
    }
    cVar19._M_current = cVar14._M_current;
    if (lVar16 == 3) {
      cVar19._M_current = pCVar20;
      if (puVar4[(uint)*pCVar20 & 0x7fffffff] == '\0') {
        pCVar20 = pCVar20 + 1;
        goto LAB_002749f7;
      }
      goto LAB_00274a2b;
    }
  }
LAB_00274a6f:
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::erase
            (clique,cVar19,cVar14);
  pCVar5 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar13 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar5;
      pCVar13 = pCVar13 + 1) {
    uVar12 = (int)*pCVar13 << 1 | (uint)((int)*pCVar13 < 0);
    _cliqueid = this;
    HighsHashTree<int,_int>::
    for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:108:42)_&,_0>
              ((NodePtr)(this->invertedHashList).
                        super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar12].root.ptrAndType,
               (anon_class_8_1_8991fb9c *)&cliqueid);
    _cliqueid = this;
    HighsHashTree<int,_void>::
    for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:115:49)_&,_0>
              ((NodePtr)(this->invertedHashListSizeTwo).
                        super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar12].root.ptrAndType,
               (anon_class_8_1_8991fb9c *)&cliqueid);
  }
  piVar17 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar6 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50 = 0;
  local_54 = 0;
  for (; iVar3 = local_54, piVar17 != piVar6; piVar17 = piVar17 + 1) {
    iVar3 = *piVar17;
    cliqueid = iVar3;
    puVar7 = (this->cliquehits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = puVar7[iVar3];
    puVar7[iVar3] = 0;
    pCVar13 = (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pCVar5 = (clique->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (uVar12 == (uint)((ulong)((long)pCVar5 - (long)pCVar13) >> 2)) {
      local_50 = (uint)CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
    }
    else {
      pCVar15 = (this->cliques).
                super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar3;
      if (pCVar15->end - (pCVar15->start + pCVar15->numZeroFixed) == uVar12) {
        if (pCVar15->equality == true) {
          for (; pCVar13 != pCVar5; pCVar13 = pCVar13 + 1) {
            v = *pCVar13;
            pCVar15 = (this->cliques).
                      super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar12 = (int)v << 1 | (uint)((int)v < 0);
            if (pCVar15[cliqueid].end - pCVar15[cliqueid].start == 2) {
              bVar11 = HighsHashTree<int,_void>::contains
                                 ((this->invertedHashListSizeTwo).
                                  super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (int)uVar12,&cliqueid)
              ;
            }
            else {
              bVar11 = HighsHashTree<int,_int>::contains
                                 ((this->invertedHashList).
                                  super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (int)uVar12,&cliqueid)
              ;
            }
            if (bVar11 == false) {
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::push_back(&this->infeasvertexstack,&v);
            }
          }
        }
        else {
          local_54 = local_54 + 1;
          pCVar15->origin = 0x7fffffff;
          removeClique(this,iVar3);
        }
      }
    }
  }
  piVar8 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar8) {
    (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar8;
  }
  if (((local_50 & 1) != 0) &&
     (pCVar13 = (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_start,
     (clique->
     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>).
     _M_impl.super__Vector_impl_data._M_finish != pCVar13)) {
    (clique->
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar13;
  }
  if ((this->infeasvertexstack).
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->infeasvertexstack).
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    return local_54;
  }
  pCVar13 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_start;
  cVar14._M_current =
       (clique->
       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)cVar14._M_current - (long)pCVar13;
  pdVar9 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar18 = lVar16 >> 4; 0 < lVar18; lVar18 = lVar18 + -1) {
    if ((pdVar9[(uint)*pCVar13 & 0x7fffffff] == pdVar10[(uint)*pCVar13 & 0x7fffffff]) &&
       (!NAN(pdVar9[(uint)*pCVar13 & 0x7fffffff]) && !NAN(pdVar10[(uint)*pCVar13 & 0x7fffffff])))
    goto LAB_00274d66;
    if ((pdVar9[(uint)pCVar13[1] & 0x7fffffff] == pdVar10[(uint)pCVar13[1] & 0x7fffffff]) &&
       (!NAN(pdVar9[(uint)pCVar13[1] & 0x7fffffff]) && !NAN(pdVar10[(uint)pCVar13[1] & 0x7fffffff]))
       ) {
      pCVar13 = pCVar13 + 1;
      goto LAB_00274d66;
    }
    if ((pdVar9[(uint)pCVar13[2] & 0x7fffffff] == pdVar10[(uint)pCVar13[2] & 0x7fffffff]) &&
       (!NAN(pdVar9[(uint)pCVar13[2] & 0x7fffffff]) && !NAN(pdVar10[(uint)pCVar13[2] & 0x7fffffff]))
       ) {
      pCVar13 = pCVar13 + 2;
      goto LAB_00274d66;
    }
    if ((pdVar9[(uint)pCVar13[3] & 0x7fffffff] == pdVar10[(uint)pCVar13[3] & 0x7fffffff]) &&
       (!NAN(pdVar9[(uint)pCVar13[3] & 0x7fffffff]) && !NAN(pdVar10[(uint)pCVar13[3] & 0x7fffffff]))
       ) {
      pCVar13 = pCVar13 + 3;
      goto LAB_00274d66;
    }
    pCVar13 = pCVar13 + 4;
    lVar16 = lVar16 + -0x10;
  }
  lVar16 = lVar16 >> 2;
  cVar19._M_current = cVar14._M_current;
  if (lVar16 == 1) {
LAB_00274d37:
    if ((pdVar9[(uint)*pCVar13 & 0x7fffffff] != pdVar10[(uint)*pCVar13 & 0x7fffffff]) ||
       (NAN(pdVar9[(uint)*pCVar13 & 0x7fffffff]) || NAN(pdVar10[(uint)*pCVar13 & 0x7fffffff])))
    goto LAB_00274dbc;
  }
  else if (lVar16 == 2) {
LAB_00274d19:
    if ((pdVar9[(uint)*pCVar13 & 0x7fffffff] != pdVar10[(uint)*pCVar13 & 0x7fffffff]) ||
       (NAN(pdVar9[(uint)*pCVar13 & 0x7fffffff]) || NAN(pdVar10[(uint)*pCVar13 & 0x7fffffff]))) {
      pCVar13 = pCVar13 + 1;
      goto LAB_00274d37;
    }
  }
  else {
    if (lVar16 != 3) goto LAB_00274dbc;
    if ((pdVar9[(uint)*pCVar13 & 0x7fffffff] != pdVar10[(uint)*pCVar13 & 0x7fffffff]) ||
       (NAN(pdVar9[(uint)*pCVar13 & 0x7fffffff]) || NAN(pdVar10[(uint)*pCVar13 & 0x7fffffff]))) {
      pCVar13 = pCVar13 + 1;
      goto LAB_00274d19;
    }
  }
LAB_00274d66:
  cVar19._M_current = pCVar13;
  if (pCVar13 != cVar14._M_current) {
    do {
      do {
        pCVar13 = pCVar13 + 1;
        if (pCVar13 == cVar14._M_current) {
          cVar14._M_current =
               (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_00274dbc;
        }
        uVar12 = (uint)*pCVar13 & 0x7fffffff;
        dVar2 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        pdVar1 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start + uVar12;
      } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
      *cVar19._M_current = *pCVar13;
      cVar19._M_current = cVar19._M_current + 1;
    } while( true );
  }
LAB_00274dbc:
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::erase
            (clique,cVar19,cVar14);
  return iVar3;
}

Assistant:

HighsInt HighsCliqueTable::runCliqueSubsumption(
    const HighsDomain& globaldom, std::vector<CliqueVar>& clique) {
  if (clique.size() == 2) return 0;
  HighsInt nremoved = 0;
  bool redundant = false;
  if (cliquehits.size() < cliques.size()) cliquehits.resize(cliques.size());

  clique.erase(
      std::remove_if(clique.begin(), clique.end(),
                     [&](CliqueVar clqvar) { return colDeleted[clqvar.col]; }),
      clique.end());

  for (CliqueVar v : clique) {
    invertedHashList[v.index()].for_each([&](HighsInt cliqueid) {
      if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

      ++cliquehits[cliqueid];
    });

    // for (const auto& entry : invertedHashListSizeTwo[v.index()])
    invertedHashListSizeTwo[v.index()].for_each([&](HighsInt cliqueid) {
      if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

      ++cliquehits[cliqueid];
    });
  }

  for (HighsInt cliqueid : cliquehitinds) {
    HighsInt hits = cliquehits[cliqueid];
    cliquehits[cliqueid] = 0;

    HighsInt len = cliques[cliqueid].end - cliques[cliqueid].start -
                   cliques[cliqueid].numZeroFixed;
    if (hits == (HighsInt)clique.size())
      redundant = true;
    else if (len == hits) {
      if (cliques[cliqueid].equality) {
        for (CliqueVar v : clique) {
          bool sizeTwo = cliques[cliqueid].end - cliques[cliqueid].start == 2;
          bool vHasClq =
              sizeTwo ? invertedHashListSizeTwo[v.index()].contains(cliqueid)
                      : invertedHashList[v.index()].contains(cliqueid);
          if (!vHasClq) infeasvertexstack.push_back(v);
        }
      } else {
        ++nremoved;
        cliques[cliqueid].origin = kHighsIInf;
        removeClique(cliqueid);
      }
    }
  }

  cliquehitinds.clear();

  if (redundant) clique.clear();

  if (!infeasvertexstack.empty()) {
    clique.erase(
        std::remove_if(clique.begin(), clique.end(),
                       [&](CliqueVar v) { return globaldom.isFixed(v.col); }),
        clique.end());
  }

  return nremoved;
}